

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O1

int64_t __thiscall CBlockIndex::GetMedianTimePast(CBlockIndex *this)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  int64_t pmedian [11];
  ulong local_28 [2];
  
  local_28[1] = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = 0;
  puVar4 = local_28 + 1;
  uVar2 = 0;
  do {
    puVar4[0xffffffffffffffff] = (ulong)this->nTime;
    puVar4 = puVar4 + 0xffffffffffffffff;
    lVar5 = lVar5 + 8;
    if (9 < uVar2) break;
    uVar2 = uVar2 + 1;
    this = this->pprev;
  } while (this != (CBlockIndex *)0x0);
  uVar3 = lVar5 >> 3;
  if (lVar5 != 0) {
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<long*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,local_28 + 1,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(puVar4,local_28 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28[1]) {
    return *(int64_t *)((long)puVar4 + (uVar3 - (lVar5 >> 0x3f) & 0xfffffffffffffffe) * 4);
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetMedianTimePast() const
    {
        int64_t pmedian[nMedianTimeSpan];
        int64_t* pbegin = &pmedian[nMedianTimeSpan];
        int64_t* pend = &pmedian[nMedianTimeSpan];

        const CBlockIndex* pindex = this;
        for (int i = 0; i < nMedianTimeSpan && pindex; i++, pindex = pindex->pprev)
            *(--pbegin) = pindex->GetBlockTime();

        std::sort(pbegin, pend);
        return pbegin[(pend - pbegin) / 2];
    }